

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O0

void __thiscall LruHash<IPAsKeyLRU>::LruUnlink(LruHash<IPAsKeyLRU> *this,IPAsKeyLRU *key)

{
  IPAsKeyLRU *key_local;
  LruHash<IPAsKeyLRU> *this_local;
  
  if (key != (IPAsKeyLRU *)0x0) {
    if (key->MoreRecentKey == (IPAsKeyLRU *)0x0) {
      this->MostRecentlyUsed = key->LessRecentKey;
    }
    else {
      key->MoreRecentKey->LessRecentKey = key->LessRecentKey;
    }
    if (key->LessRecentKey == (IPAsKeyLRU *)0x0) {
      this->LeastRecentlyUsed = key->MoreRecentKey;
    }
    else {
      key->LessRecentKey->MoreRecentKey = key->MoreRecentKey;
    }
    key->MoreRecentKey = (IPAsKeyLRU *)0x0;
    key->LessRecentKey = (IPAsKeyLRU *)0x0;
  }
  return;
}

Assistant:

void LruUnlink(KeyObj * key)
    {
        if (key != NULL)
        {
            /* If the object was newly created, the more and less recent keys should be NULL */

            if (key->MoreRecentKey != NULL)
            {
                key->MoreRecentKey->LessRecentKey = key->LessRecentKey;
            }
            else
            {
                MostRecentlyUsed = key->LessRecentKey;
            }

            if (key->LessRecentKey != NULL)
            {
                key->LessRecentKey->MoreRecentKey = key->MoreRecentKey;
            }
            else
            {
                LeastRecentlyUsed = key->MoreRecentKey;
            }

            key->MoreRecentKey = NULL;
            key->LessRecentKey = NULL;
        }
    }